

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

bool ParameterTraits<bool>::convert(string *v,RepType_conflict *r)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  char *in_RDI;
  bool result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool local_25;
  locale *in_stack_ffffffffffffffe8;
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xffffffffffffffe8;
  std::locale::locale((locale *)__lhs);
  OpenMD::toLower<std::__cxx11::string>(in_RSI,in_stack_ffffffffffffffe8);
  std::locale::~locale((locale *)&stack0xffffffffffffffe8);
  bVar1 = std::operator==(__lhs,in_RDI);
  if (bVar1) {
    in_RSI->_M_dataplus = (_Alloc_hider)0x1;
    local_25 = true;
  }
  else {
    local_25 = std::operator==(__lhs,in_RDI);
    if (local_25) {
      in_RSI->_M_dataplus = (_Alloc_hider)0x0;
    }
  }
  return local_25;
}

Assistant:

static bool convert(std::string v, RepType& r) {
    OpenMD::toLower(v);
    bool result = false;
    if (v == "true") {
      r      = true;
      result = true;
    } else if (v == "false") {
      r      = false;
      result = true;
    }

    return result;
  }